

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O3

void __thiscall HEkkDual::minorUpdateRows(HEkkDual *this)

{
  __atomic_base<int> _Var1;
  HVectorBase<double> *pHVar2;
  element_type *peVar3;
  HVectorBase<double> *this_00;
  HighsTask *pHVar4;
  HighsSplitDeque *pHVar5;
  HEkkDual *pHVar6;
  uint uVar7;
  long *plVar8;
  uint32_t uVar9;
  ulong uVar10;
  HighsInt start;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  uint end;
  vector<double,_std::allocator<double>_> *pvVar14;
  double dVar15;
  HVector *Row;
  double multi_xpivot [8];
  HighsInt multi_iwhich [8];
  HVector_ptr multi_vector [8];
  TaskGroup local_110;
  anon_class_32_4_068a6c9c local_100;
  HVectorBase<double> *local_e0;
  double local_d8 [8];
  int aiStack_98 [8];
  HVectorBase<double> *local_78 [9];
  
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x48,0);
  pHVar2 = this->multi_finish[this->multi_nFinish].row_ep;
  local_e0 = pHVar2;
  if ((pHVar2->count < 0) || ((double)this->solver_num_row * 0.1 < (double)pHVar2->count)) {
    if (0 < this->multi_num) {
      pvVar14 = &this->multi_choice[0].row_ep.array;
      lVar11 = 0;
      uVar12 = 0;
      do {
        if ((-1 < *(int *)((long)(pvVar14 + -4) + 8)) &&
           (dVar15 = HighsSparseMatrix::computeDot(this->a_matrix,pvVar14,this->variable_in),
           1e-14 <= ABS(dVar15))) {
          local_78[(int)uVar12] = (HVectorBase<double> *)((long)(pvVar14 + -2) + 0x10);
          local_d8[(int)uVar12] = -dVar15 / this->alpha_row;
          aiStack_98[(int)uVar12] = (int)lVar11;
          uVar12 = uVar12 + 1;
        }
        lVar11 = lVar11 + 1;
        pvVar14 = (vector<double,_std::allocator<double>_> *)((long)(pvVar14 + 0x18) + 8);
      } while (lVar11 < this->multi_num);
      local_100.multi_vector = (HVector_ptr (*) [8])local_78;
      local_100.multi_xpivot = &local_d8;
      local_100.Row = &local_e0;
      local_100.this = this;
      if ((int)uVar12 < 2) {
        if (uVar12 != 1) goto LAB_0034fe50;
        HVectorBase<double>::saxpy<double,double>(local_78[0],local_d8[0],pHVar2);
        HVectorBase<double>::tight(local_78[0]);
        uVar13 = 1;
        if (this->edge_weight_mode == kSteepestEdge) {
          local_d8[0] = HVectorBase<double>::norm2(local_78[0]);
        }
      }
      else {
        HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
        plVar8 = (long *)__tls_get_addr(&PTR_00441ef0);
        local_110.workerDeque = (HighsSplitDeque *)*plVar8;
        local_110.dequeHead = ((local_110.workerDeque)->ownerData).head;
        uVar13 = (ulong)uVar12;
        do {
          pHVar5 = local_110.workerDeque;
          uVar7 = ((local_110.workerDeque)->ownerData).head;
          uVar10 = (ulong)uVar7;
          start = (HighsInt)(uVar13 >> 1);
          end = (uint)uVar13;
          if (uVar10 < 0x2000) {
            uVar9 = (uint32_t)(uVar10 + 1);
            ((local_110.workerDeque)->ownerData).head = uVar9;
            ((local_110.workerDeque)->taskArray)._M_elems[uVar10].metadata.stealer.
            super___atomic_base<unsigned_long>._M_i = 0;
            *(undefined ***)((local_110.workerDeque)->taskArray)._M_elems[uVar10].taskData =
                 &PTR_operator___004414d8;
            *(HighsInt *)(((local_110.workerDeque)->taskArray)._M_elems[uVar10].taskData + 8) =
                 start;
            *(uint *)(((local_110.workerDeque)->taskArray)._M_elems[uVar10].taskData + 0xc) = end;
            pHVar4 = ((local_110.workerDeque)->taskArray)._M_elems + uVar10;
            pHVar4->taskData[0x10] = '\x01';
            pHVar4->taskData[0x11] = '\0';
            pHVar4->taskData[0x12] = '\0';
            pHVar4->taskData[0x13] = '\0';
            *(anon_class_32_4_068a6c9c **)
             (((local_110.workerDeque)->taskArray)._M_elems[uVar10].taskData + 0x18) = &local_100;
            if (((local_110.workerDeque)->ownerData).allStolenCopy == true) {
              ((local_110.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
                   uVar10 << 0x20 | uVar10 + 1;
              ((local_110.workerDeque)->stealerData).allStolen._M_base._M_i = false;
              ((local_110.workerDeque)->ownerData).splitCopy = uVar9;
              ((local_110.workerDeque)->ownerData).allStolenCopy = false;
              if ((((local_110.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
                ((local_110.workerDeque)->splitRequest)._M_base._M_i = false;
              }
              peVar3 = ((local_110.workerDeque)->ownerData).workerBunk.
                       super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              LOCK();
              _Var1._M_i = (peVar3->haveJobs).super___atomic_base<int>._M_i;
              (peVar3->haveJobs).super___atomic_base<int>._M_i =
                   (peVar3->haveJobs).super___atomic_base<int>._M_i + 1;
              UNLOCK();
              if (_Var1._M_i < ((local_110.workerDeque)->ownerData).numWorkers + -1) {
                HighsSplitDeque::WorkerBunk::publishWork
                          (((local_110.workerDeque)->ownerData).workerBunk.
                           super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,local_110.workerDeque);
              }
            }
            else {
              HighsSplitDeque::growShared(local_110.workerDeque);
            }
          }
          else {
            if ((((local_110.workerDeque)->ownerData).splitCopy < 0x2000) &&
               (((local_110.workerDeque)->ownerData).allStolenCopy == false)) {
              HighsSplitDeque::growShared(local_110.workerDeque);
              uVar7 = (pHVar5->ownerData).head;
            }
            (pHVar5->ownerData).head = uVar7 + 1;
            ::highs::parallel::for_each<HEkkDual::minorUpdateRows()::__0&>(start,end,&local_100,1);
          }
          pHVar6 = local_100.this;
          uVar13 = uVar13 >> 1;
        } while (3 < end);
        if (1 < end) {
          pHVar2 = (*local_100.multi_vector)[0];
          HVectorBase<double>::saxpy<double,double>
                    (pHVar2,(*local_100.multi_xpivot)[0],*local_100.Row);
          HVectorBase<double>::tight(pHVar2);
          if (pHVar6->edge_weight_mode == kSteepestEdge) {
            dVar15 = HVectorBase<double>::norm2(pHVar2);
            (*local_100.multi_xpivot)[0] = dVar15;
          }
        }
        ::highs::parallel::TaskGroup::taskWait(&local_110);
        ::highs::parallel::TaskGroup::~TaskGroup(&local_110);
        uVar13 = (ulong)uVar12;
      }
      if (this->edge_weight_mode == kSteepestEdge) {
        uVar10 = 0;
        do {
          this->multi_choice[aiStack_98[uVar10]].infeasEdWt = local_d8[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar13 != uVar10);
      }
    }
  }
  else if (0 < this->multi_num) {
    pvVar14 = &this->multi_choice[0].row_ep.array;
    lVar11 = 0;
    do {
      if ((-1 < *(int *)((long)(pvVar14 + -4) + 8)) &&
         (dVar15 = HighsSparseMatrix::computeDot(this->a_matrix,pvVar14,this->variable_in),
         1e-14 <= ABS(dVar15))) {
        this_00 = (HVectorBase<double> *)((long)(pvVar14 + -2) + 0x10);
        HVectorBase<double>::saxpy<double,double>(this_00,-dVar15 / this->alpha_row,pHVar2);
        HVectorBase<double>::tight(this_00);
        if (this->edge_weight_mode == kSteepestEdge) {
          dVar15 = HVectorBase<double>::norm2(this_00);
          *(double *)(pvVar14 + -2) = dVar15;
        }
      }
      lVar11 = lVar11 + 1;
      pvVar14 = (vector<double,_std::allocator<double>_> *)((long)(pvVar14 + 0x18) + 8);
    } while (lVar11 < this->multi_num);
  }
LAB_0034fe50:
  HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x48,0);
  return;
}

Assistant:

void HEkkDual::minorUpdateRows() {
  analysis->simplexTimerStart(UpdateRowClock);
  const HVector* Row = multi_finish[multi_nFinish].row_ep;
  HighsInt updateRows_inDense =
      (Row->count < 0) || (Row->count > 0.1 * solver_num_row);
  if (updateRows_inDense) {
    HighsInt multi_nTasks = 0;
    HighsInt multi_iwhich[kSimplexConcurrencyLimit];
    double multi_xpivot[kSimplexConcurrencyLimit];
    HVector_ptr multi_vector[kSimplexConcurrencyLimit];

    /*
     * Dense mode
     *  1. Find which ones to do and the pivotX
     *  2. Do all of them in task parallel
     */

    // Collect tasks
    for (HighsInt ich = 0; ich < multi_num; ich++) {
      if (multi_choice[ich].row_out >= 0) {
        HVector* next_ep = &multi_choice[ich].row_ep;
        double pivotX = a_matrix->computeDot(*next_ep, variable_in);
        if (fabs(pivotX) < kHighsTiny) continue;
        multi_vector[multi_nTasks] = next_ep;
        multi_xpivot[multi_nTasks] = -pivotX / alpha_row;
        multi_iwhich[multi_nTasks] = ich;
        multi_nTasks++;
      }
    }

    // Perform tasks
    // #pragma omp parallel for schedule(dynamic)
    // printf("minorUpdatesRows: starting %d tasks\n", multi_nTasks);
    highs::parallel::for_each(
        0, multi_nTasks, [&](HighsInt start, HighsInt end) {
          for (HighsInt i = start; i < end; i++) {
            HVector_ptr nextEp = multi_vector[i];
            const double xpivot = multi_xpivot[i];
            nextEp->saxpy(xpivot, Row);
            nextEp->tight();
            if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
              multi_xpivot[i] = nextEp->norm2();
            }
          }
        });

    // Put weight back
    if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
      for (HighsInt i = 0; i < multi_nTasks; i++)
        multi_choice[multi_iwhich[i]].infeasEdWt = multi_xpivot[i];
    }
  } else {
    // Sparse mode: just do it sequentially
    for (HighsInt ich = 0; ich < multi_num; ich++) {
      if (multi_choice[ich].row_out >= 0) {
        HVector* next_ep = &multi_choice[ich].row_ep;
        double pivotX = a_matrix->computeDot(*next_ep, variable_in);
        if (fabs(pivotX) < kHighsTiny) continue;
        next_ep->saxpy(-pivotX / alpha_row, Row);
        next_ep->tight();
        if (edge_weight_mode == EdgeWeightMode::kSteepestEdge) {
          multi_choice[ich].infeasEdWt = next_ep->norm2();
        }
      }
    }
  }
  analysis->simplexTimerStop(UpdateRowClock);
}